

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_intel.c
# Opt level: O0

void decode_intel_oldstyle_cache_info(cpu_raw_data_t *raw,cpu_id_t *data)

{
  uint local_124;
  int local_120;
  uint32_t x;
  int off;
  int reg;
  uint8_t f [256];
  cpu_id_t *data_local;
  cpu_raw_data_t *raw_local;
  
  f._248_8_ = data;
  memset(&off,0,0x100);
  for (x = 0; (int)x < 4; x = x + 1) {
    local_124 = raw->basic_cpuid[2][(int)x];
    if ((local_124 & 0x80000000) == 0) {
      for (local_120 = 0; local_120 < 4; local_120 = local_120 + 1) {
        *(undefined1 *)((long)&off + (ulong)(local_124 & 0xff)) = 1;
        local_124 = local_124 >> 8;
      }
    }
  }
  assign_cache_data(reg._2_1_,L1I,8,4,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0],L1I,0x10,4,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[2],L1D,8,2,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[4],L1D,0x10,4,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x1a],L3,0x200,4,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x1b],L3,0x400,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x1d],L3,0x800,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x21],L3,0x1000,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x24],L1D,0x20,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x28],L1I,0x20,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x31],L2,0x80,4,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x32],L2,0xc0,6,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x33],L2,0x80,2,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x34],L2,0x100,4,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x35],L2,0x180,6,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x36],L2,0x200,4,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x39],L2,0x80,4,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x3a],L2,0x100,4,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x3b],L2,0x200,4,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x3c],L2,0x400,4,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x3d],L2,0x800,4,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x3e],L3,0x1000,4,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x3f],L3,0x2000,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x42],L3,0x1800,0xc,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x43],L3,0x2000,0x10,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x44],L3,0x3000,0xc,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x45],L3,0x4000,0x10,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x46],L2,0x1800,0x18,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x58],L1D,0x10,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x5e],L1D,8,4,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x5f],L1D,0x10,4,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x60],L1D,0x20,4,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x68],L1I,0xc,8,-1,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x69],L1I,0x10,8,-1,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x6a],L1I,0x20,8,-1,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x6b],L1I,0x40,8,-1,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x70],L2,0x400,4,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x71],L2,0x80,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x72],L2,0x100,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x73],L2,0x200,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x74],L2,0x400,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x75],L2,0x800,8,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x77],L2,0x200,2,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x7a],L2,0x100,8,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x7b],L2,0x200,8,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x7c],L2,0x400,8,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x7d],L2,0x800,8,0x20,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x7e],L2,0x200,4,0x40,(cpu_id_t *)f._248_8_);
  assign_cache_data(f[0x7f],L2,0x400,8,0x40,(cpu_id_t *)f._248_8_);
  if (f[0x41] != '\0') {
    if ((*(int *)(f._248_8_ + 0x1f0) == 0xf) && (*(int *)(f._248_8_ + 500) == 6)) {
      *(undefined4 *)(f._248_8_ + 0x250) = 0x1000;
      *(undefined4 *)(f._248_8_ + 0x268) = 0x10;
      *(undefined4 *)(f._248_8_ + 0x280) = 0x40;
    }
    else {
      *(undefined4 *)(f._248_8_ + 0x24c) = 0x1000;
      *(undefined4 *)(f._248_8_ + 0x264) = 0x10;
      *(undefined4 *)(f._248_8_ + 0x27c) = 0x40;
    }
  }
  if (f[0x38] != '\0') {
    if (*(int *)(f._248_8_ + 0x24c) == -1) {
      *(undefined4 *)(f._248_8_ + 0x24c) = 0;
    }
    else {
      *(undefined4 *)(f._248_8_ + 0x250) = 0;
    }
  }
  return;
}

Assistant:

static void decode_intel_oldstyle_cache_info(struct cpu_raw_data_t* raw, struct cpu_id_t* data)
{
	uint8_t f[256] = {0};
	int reg, off;
	uint32_t x;
	for (reg = 0; reg < 4; reg++) {
		x = raw->basic_cpuid[2][reg];
		if (x & 0x80000000) continue;
		for (off = 0; off < 4; off++) {
			f[x & 0xff] = 1;
			x >>= 8;
		}
	}

	assign_cache_data(f[0x06], L1I,      8,  4,  32, data);
	assign_cache_data(f[0x08], L1I,     16,  4,  32, data);
	assign_cache_data(f[0x0A], L1D,      8,  2,  32, data);
	assign_cache_data(f[0x0C], L1D,     16,  4,  32, data);
	assign_cache_data(f[0x22],  L3,    512,  4,  64, data);
	assign_cache_data(f[0x23],  L3,   1024,  8,  64, data);
	assign_cache_data(f[0x25],  L3,   2048,  8,  64, data);
	assign_cache_data(f[0x29],  L3,   4096,  8,  64, data);
	assign_cache_data(f[0x2C], L1D,     32,  8,  64, data);
	assign_cache_data(f[0x30], L1I,     32,  8,  64, data);
	assign_cache_data(f[0x39],  L2,    128,  4,  64, data);
	assign_cache_data(f[0x3A],  L2,    192,  6,  64, data);
	assign_cache_data(f[0x3B],  L2,    128,  2,  64, data);
	assign_cache_data(f[0x3C],  L2,    256,  4,  64, data);
	assign_cache_data(f[0x3D],  L2,    384,  6,  64, data);
	assign_cache_data(f[0x3E],  L2,    512,  4,  64, data);
	assign_cache_data(f[0x41],  L2,    128,  4,  32, data);
	assign_cache_data(f[0x42],  L2,    256,  4,  32, data);
	assign_cache_data(f[0x43],  L2,    512,  4,  32, data);
	assign_cache_data(f[0x44],  L2,   1024,  4,  32, data);
	assign_cache_data(f[0x45],  L2,   2048,  4,  32, data);
	assign_cache_data(f[0x46],  L3,   4096,  4,  64, data);
	assign_cache_data(f[0x47],  L3,   8192,  8,  64, data);
	assign_cache_data(f[0x4A],  L3,   6144, 12,  64, data);
	assign_cache_data(f[0x4B],  L3,   8192, 16,  64, data);
	assign_cache_data(f[0x4C],  L3,  12288, 12,  64, data);
	assign_cache_data(f[0x4D],  L3,  16384, 16,  64, data);
	assign_cache_data(f[0x4E],  L2,   6144, 24,  64, data);
	assign_cache_data(f[0x60], L1D,     16,  8,  64, data);
	assign_cache_data(f[0x66], L1D,      8,  4,  64, data);
	assign_cache_data(f[0x67], L1D,     16,  4,  64, data);
	assign_cache_data(f[0x68], L1D,     32,  4,  64, data);
	/* The following four entries are trace cache. Intel does not
	 * specify a cache-line size, so we use -1 instead
	 */
	assign_cache_data(f[0x70], L1I,     12,  8,  -1, data);
	assign_cache_data(f[0x71], L1I,     16,  8,  -1, data);
	assign_cache_data(f[0x72], L1I,     32,  8,  -1, data);
	assign_cache_data(f[0x73], L1I,     64,  8,  -1, data);

	assign_cache_data(f[0x78],  L2,   1024,  4,  64, data);
	assign_cache_data(f[0x79],  L2,    128,  8,  64, data);
	assign_cache_data(f[0x7A],  L2,    256,  8,  64, data);
	assign_cache_data(f[0x7B],  L2,    512,  8,  64, data);
	assign_cache_data(f[0x7C],  L2,   1024,  8,  64, data);
	assign_cache_data(f[0x7D],  L2,   2048,  8,  64, data);
	assign_cache_data(f[0x7F],  L2,    512,  2,  64, data);
	assign_cache_data(f[0x82],  L2,    256,  8,  32, data);
	assign_cache_data(f[0x83],  L2,    512,  8,  32, data);
	assign_cache_data(f[0x84],  L2,   1024,  8,  32, data);
	assign_cache_data(f[0x85],  L2,   2048,  8,  32, data);
	assign_cache_data(f[0x86],  L2,    512,  4,  64, data);
	assign_cache_data(f[0x87],  L2,   1024,  8,  64, data);

	if (f[0x49]) {
		/* This flag is overloaded with two meanings. On Xeon MP
		 * (family 0xf, model 0x6) this means L3 cache. On all other
		 * CPUs (notably Conroe et al), this is L2 cache. In both cases
		 * it means 4MB, 16-way associative, 64-byte line size.
		 */
		if (data->x86.family == 0xf && data->x86.model == 0x6) {
			data->l3_cache = 4096;
			data->l3_assoc = 16;
			data->l3_cacheline = 64;
		} else {
			data->l2_cache = 4096;
			data->l2_assoc = 16;
			data->l2_cacheline = 64;
		}
	}
	if (f[0x40]) {
		/* Again, a special flag. It means:
		 * 1) If no L2 is specified, then CPU is w/o L2 (0 KB)
		 * 2) If L2 is specified by other flags, then, CPU is w/o L3.
		 */
		if (data->l2_cache == -1) {
			data->l2_cache = 0;
		} else {
			data->l3_cache = 0;
		}
	}
}